

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

int Disto16x16_C(uint8_t *a,uint8_t *b,uint16_t *w)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = 0;
  for (uVar3 = 0; uVar3 < 0x200; uVar3 = uVar3 + 0x80) {
    for (uVar4 = 0; uVar4 < 0x10; uVar4 = uVar4 + 4) {
      iVar1 = Disto4x4_C(a + uVar4,b + uVar4,w);
      iVar2 = iVar2 + iVar1;
    }
    a = a + 0x80;
    b = b + 0x80;
  }
  return iVar2;
}

Assistant:

static int Disto16x16_C(const uint8_t* WEBP_RESTRICT const a,
                        const uint8_t* WEBP_RESTRICT const b,
                        const uint16_t* WEBP_RESTRICT const w) {
  int D = 0;
  int x, y;
  for (y = 0; y < 16 * BPS; y += 4 * BPS) {
    for (x = 0; x < 16; x += 4) {
      D += Disto4x4_C(a + x + y, b + x + y, w);
    }
  }
  return D;
}